

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall
presolve::HPresolve::changeRowDualLower(HPresolve *this,HighsInt row,double newLower)

{
  double oldVarLower;
  int node;
  pointer pdVar1;
  iterator __begin1;
  iterator local_68;
  
  pdVar1 = (this->rowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  oldVarLower = pdVar1[row];
  pdVar1[row] = newLower;
  node = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[row];
  if (node == -1) {
    local_68.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_68.nodeLeft = (HighsInt *)0x0;
    local_68.nodeRight = (HighsInt *)0x0;
    local_68.pos_.index_ = (HighsInt *)0x0;
    local_68.pos_.value_ = (double *)0x0;
    local_68.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_68.currentNode = -1;
  }
  else {
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::iterator
              (&local_68,
               (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,node);
  }
  while (local_68.currentNode != -1) {
    HighsLinearSumBounds::updatedVarLower
              (&this->impliedDualRowBounds,*local_68.pos_.index_,row,*local_68.pos_.value_,
               oldVarLower);
    markChangedCol(this,*local_68.pos_.index_);
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(&local_68);
  }
  if (local_68.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HPresolve::changeRowDualLower(HighsInt row, double newLower) {
  double oldLower = rowDualLower[row];
  rowDualLower[row] = newLower;
  // printf("tightening lower bound of column %" HIGHSINT_FORMAT " from %.15g to
  // %.15g\n", col,
  //        oldLower, newLower);

  for (const HighsSliceNonzero& nonzero : getRowVector(row)) {
    impliedDualRowBounds.updatedVarLower(nonzero.index(), row, nonzero.value(),
                                         oldLower);
    markChangedCol(nonzero.index());
  }
}